

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int writeSuperJournal(Pager *pPager,char *zSuper)

{
  long lVar1;
  i64 iVar2;
  long in_RSI;
  Pager *in_RDI;
  long in_FS_OFFSET;
  u32 cksum;
  i64 iHdrOff;
  int nSuper;
  int rc;
  i64 jrnlSize;
  i64 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  u32 val;
  void *pBuf;
  uint uVar3;
  undefined4 uVar4;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0xaaaaaaaa;
  val = 0;
  if (((in_RSI == 0) || (in_RDI->journalMode == '\x04')) ||
     (in_RDI->jfd->pMethods == (sqlite3_io_methods *)0x0)) {
    local_14 = 0;
  }
  else {
    in_RDI->setSuper = '\x01';
    for (uVar3 = 0; *(char *)(in_RSI + (int)uVar3) != '\0'; uVar3 = uVar3 + 1) {
      val = (int)*(char *)(in_RSI + (int)uVar3) + val;
    }
    if (in_RDI->fullSync != '\0') {
      iVar2 = journalHdrOffset(in_RDI);
      in_RDI->journalOff = iVar2;
    }
    pBuf = (void *)in_RDI->journalOff;
    local_14 = write32bits((sqlite3_file *)CONCAT44(uVar4,uVar3),(i64)pBuf,val);
    if (((local_14 == 0) &&
        (local_14 = sqlite3OsWrite((sqlite3_file *)(ulong)uVar3,pBuf,val,
                                   (i64)in_stack_ffffffffffffffb8), local_14 == 0)) &&
       ((local_14 = write32bits((sqlite3_file *)(ulong)uVar3,(i64)pBuf,val), local_14 == 0 &&
        ((local_14 = write32bits((sqlite3_file *)(ulong)uVar3,(i64)pBuf,val), local_14 == 0 &&
         (local_14 = sqlite3OsWrite((sqlite3_file *)(ulong)uVar3,pBuf,val,
                                    (i64)in_stack_ffffffffffffffb8), local_14 == 0)))))) {
      in_RDI->journalOff = (long)(int)(uVar3 + 0x14) + in_RDI->journalOff;
      local_14 = sqlite3OsFileSize((sqlite3_file *)CONCAT44(val,in_stack_ffffffffffffffc0),
                                   in_stack_ffffffffffffffb8);
      if ((local_14 == 0) && (in_RDI->journalOff < -0x5555555555555556)) {
        local_14 = sqlite3OsTruncate((sqlite3_file *)CONCAT44(val,in_stack_ffffffffffffffc0),
                                     (i64)in_stack_ffffffffffffffb8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int writeSuperJournal(Pager *pPager, const char *zSuper){
  int rc;                          /* Return code */
  int nSuper;                      /* Length of string zSuper */
  i64 iHdrOff;                     /* Offset of header in journal file */
  i64 jrnlSize;                    /* Size of journal file on disk */
  u32 cksum = 0;                   /* Checksum of string zSuper */

  assert( pPager->setSuper==0 );
  assert( !pagerUseWal(pPager) );

  if( !zSuper
   || pPager->journalMode==PAGER_JOURNALMODE_MEMORY
   || !isOpen(pPager->jfd)
  ){
    return SQLITE_OK;
  }
  pPager->setSuper = 1;
  assert( pPager->journalHdr <= pPager->journalOff );

  /* Calculate the length in bytes and the checksum of zSuper */
  for(nSuper=0; zSuper[nSuper]; nSuper++){
    cksum += zSuper[nSuper];
  }

  /* If in full-sync mode, advance to the next disk sector before writing
  ** the super-journal name. This is in case the previous page written to
  ** the journal has already been synced.
  */
  if( pPager->fullSync ){
    pPager->journalOff = journalHdrOffset(pPager);
  }
  iHdrOff = pPager->journalOff;

  /* Write the super-journal data to the end of the journal file. If
  ** an error occurs, return the error code to the caller.
  */
  if( (0 != (rc = write32bits(pPager->jfd, iHdrOff, PAGER_SJ_PGNO(pPager))))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, zSuper, nSuper, iHdrOff+4)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nSuper, nSuper)))
   || (0 != (rc = write32bits(pPager->jfd, iHdrOff+4+nSuper+4, cksum)))
   || (0 != (rc = sqlite3OsWrite(pPager->jfd, aJournalMagic, 8,
                                 iHdrOff+4+nSuper+8)))
  ){
    return rc;
  }
  pPager->journalOff += (nSuper+20);

  /* If the pager is in persistent-journal mode, then the physical
  ** journal-file may extend past the end of the super-journal name
  ** and 8 bytes of magic data just written to the file. This is
  ** dangerous because the code to rollback a hot-journal file
  ** will not be able to find the super-journal name to determine
  ** whether or not the journal is hot.
  **
  ** Easiest thing to do in this scenario is to truncate the journal
  ** file to the required size.
  */
  if( SQLITE_OK==(rc = sqlite3OsFileSize(pPager->jfd, &jrnlSize))
   && jrnlSize>pPager->journalOff
  ){
    rc = sqlite3OsTruncate(pPager->jfd, pPager->journalOff);
  }
  return rc;
}